

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcSymObjBase::set_mod_base_sym(CTcSymObjBase *this,CTcSymObj *sym)

{
  CTcSymObjBase *in_RSI;
  CTcSymObj *in_RDI;
  
  (in_RDI->super_CTcSymObjBase).mod_base_sym_ = (CTcSymObj *)in_RSI;
  if (in_RSI != (CTcSymObjBase *)0x0) {
    set_modifying_sym(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void CTcSymObjBase::set_mod_base_sym(CTcSymObj *sym)
{
    /* remember the object I'm modifying */
    mod_base_sym_ = sym;

    /* 
     *   set the other object's link back to me, so it knows that I'm the
     *   object that's modifying it 
     */
    if (sym != 0)
        sym->set_modifying_sym((CTcSymObj *)this);
}